

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer_matrix_uniform.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  _Setprecision _Var2;
  istream *piVar3;
  ostream *poVar4;
  ostream *poVar5;
  long in_RSI;
  int in_EDI;
  double dVar6;
  double f;
  double beta;
  double t;
  double t_step;
  double t_max;
  double t_min;
  double H;
  double J;
  int L;
  size_t *in_stack_fffffffffffffe08;
  string *in_stack_fffffffffffffe10;
  double in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  double local_148;
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [55];
  allocator local_61;
  string local_60 [32];
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  int local_14;
  long local_10;
  int local_4;
  
  local_4 = 0;
  if (in_EDI < 7) {
    piVar3 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_14);
    piVar3 = (istream *)std::istream::operator>>(piVar3,&local_20);
    piVar3 = (istream *)std::istream::operator>>(piVar3,&local_28);
    piVar3 = (istream *)std::istream::operator>>(piVar3,&local_30);
    piVar3 = (istream *)std::istream::operator>>(piVar3,&local_38);
    std::istream::operator>>(piVar3,&local_40);
  }
  else {
    pcVar1 = *(char **)(in_RSI + 8);
    local_10 = in_RSI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,pcVar1,&local_61);
    local_14 = std::__cxx11::stoi(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,0);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    pcVar1 = *(char **)(local_10 + 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,pcVar1,&local_99);
    local_20 = std::__cxx11::stod(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    pcVar1 = *(char **)(local_10 + 0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,pcVar1,&local_c1);
    local_28 = std::__cxx11::stod(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    pcVar1 = *(char **)(local_10 + 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,pcVar1,&local_e9);
    local_30 = std::__cxx11::stod(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    pcVar1 = *(char **)(local_10 + 0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,pcVar1,&local_111);
    local_38 = std::__cxx11::stod(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    in_stack_fffffffffffffe20 = *(char **)(local_10 + 0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,in_stack_fffffffffffffe20,&local_139);
    in_stack_fffffffffffffe18 =
         std::__cxx11::stod(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    local_40 = in_stack_fffffffffffffe18;
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"# L = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4,"# J = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_20);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4,"# H = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_28);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::scientific);
  _Var2 = std::setprecision(0xb);
  std::operator<<(poVar4,_Var2);
  for (local_148 = local_30; local_148 <= local_38; local_148 = local_40 + local_148) {
    dVar6 = ising::square::transfer_matrix::free_energy_density
                      ((double)in_stack_fffffffffffffe20,
                       (int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                       SUB84(in_stack_fffffffffffffe18,0),(double)poVar4,
                       (double)in_stack_fffffffffffffe08);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_148);
    poVar5 = std::operator<<(poVar5,' ');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar6);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv) {
  int L; // system size
  double J, H;
  double t_min, t_max, t_step;
  if (argc >=7) {
    L = std::stoi(argv[1]);
    J = std::stod(argv[2]);
    H = std::stod(argv[3]);
    t_min = std::stod(argv[4]);
    t_max = std::stod(argv[5]);
    t_step = std::stod(argv[6]);
  } else {
    std::cin >> L >> J >> H >> t_min >> t_max >> t_step;
  }
  std::cout << "# L = " << L << std::endl
            << "# J = " << J << std::endl
            << "# H = " << H << std::endl;
  std::cout << std::scientific << std::setprecision(11);
  for (double t = t_min; t <= t_max; t += t_step) {
    double beta = 1 / t;
    double f = ising::square::transfer_matrix::free_energy_density(beta, L, L, J, H);
    std::cout << t << ' ' << f << std::endl;
  }
}